

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O0

FT_Error bsdf_approximate_edge(BSDF_Worker *worker)

{
  ED *pEVar1;
  FT_Bool FVar2;
  int iVar3;
  FT_Fixed FVar4;
  FT_16D16_Vec FVar5;
  FT_Pos local_38;
  FT_Pos local_30;
  ED *ed;
  FT_Int index;
  FT_Int j;
  FT_Int i;
  FT_Error error;
  BSDF_Worker *worker_local;
  
  j = 0;
  if ((worker == (BSDF_Worker *)0x0) || (worker->distance_map == (ED *)0x0)) {
    j = 6;
  }
  else {
    pEVar1 = worker->distance_map;
    for (ed._4_4_ = 0; ed._4_4_ < worker->rows; ed._4_4_ = ed._4_4_ + 1) {
      for (index = 0; index < worker->width; index = index + 1) {
        iVar3 = ed._4_4_ * worker->width + index;
        FVar2 = bsdf_is_edge(worker->distance_map + iVar3,index,ed._4_4_,worker->width,worker->rows)
        ;
        if (FVar2 == '\0') {
          pEVar1[iVar3].dist = 0x1900000;
          pEVar1[iVar3].prox.x = 0xc80000;
          pEVar1[iVar3].prox.y = 0xc80000;
        }
        else {
          FVar5 = compute_edge_distance(pEVar1 + iVar3,index,ed._4_4_,worker->width,worker->rows);
          local_38 = FVar5.x;
          pEVar1[iVar3].prox.x = local_38;
          local_30 = FVar5.y;
          pEVar1[iVar3].prox.y = local_30;
          FVar4 = FT_Vector_Length(&pEVar1[iVar3].prox);
          pEVar1[iVar3].dist = (FT_16D16)FVar4;
        }
      }
    }
  }
  return j;
}

Assistant:

static FT_Error
  bsdf_approximate_edge( BSDF_Worker*  worker )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Int    i, j;
    FT_Int    index;
    ED*       ed;


    if ( !worker || !worker->distance_map )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    ed = worker->distance_map;

    for ( j = 0; j < worker->rows; j++ )
    {
      for ( i = 0; i < worker->width; i++ )
      {
        index = j * worker->width + i;

        if ( bsdf_is_edge( worker->distance_map + index,
                           i, j,
                           worker->width,
                           worker->rows ) )
        {
          /* approximate the edge distance for edge pixels */
          ed[index].prox = compute_edge_distance( ed + index,
                                                  i, j,
                                                  worker->width,
                                                  worker->rows );
          ed[index].dist = VECTOR_LENGTH_16D16( ed[index].prox );
        }
        else
        {
          /* for non-edge pixels assign far away distances */
          ed[index].dist   = 400 * ONE;
          ed[index].prox.x = 200 * ONE;
          ed[index].prox.y = 200 * ONE;
        }
      }
    }

  Exit:
    return error;
  }